

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogPtr xmlLoadSGMLSuperCatalog(char *filename)

{
  int iVar1;
  xmlChar *value;
  int ret;
  xmlCatalogPtr catal;
  xmlChar *content;
  char *filename_local;
  
  value = xmlLoadFileContent(filename);
  if (value == (xmlChar *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if ((xmlCatalogPtr)filename_local == (xmlCatalogPtr)0x0) {
      (*xmlFree)(value);
      filename_local = (char *)0x0;
    }
    else {
      iVar1 = xmlParseSGMLCatalog((xmlCatalogPtr)filename_local,value,filename,1);
      (*xmlFree)(value);
      if (iVar1 < 0) {
        xmlFreeCatalog((xmlCatalogPtr)filename_local);
        filename_local = (char *)0x0;
      }
    }
  }
  return (xmlCatalogPtr)filename_local;
}

Assistant:

xmlCatalogPtr
xmlLoadSGMLSuperCatalog(const char *filename)
{
    xmlChar *content;
    xmlCatalogPtr catal;
    int ret;

    content = xmlLoadFileContent(filename);
    if (content == NULL)
        return(NULL);

    catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
    if (catal == NULL) {
	xmlFree(content);
	return(NULL);
    }

    ret = xmlParseSGMLCatalog(catal, content, filename, 1);
    xmlFree(content);
    if (ret < 0) {
	xmlFreeCatalog(catal);
	return(NULL);
    }
    return (catal);
}